

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O2

int dynamicPutbuf(gdIOCtx *ctx,void *buf,int size)

{
  appendDynamic((dynamicPtr *)ctx[1].getC,buf,size);
  return -(uint)(*(int *)(ctx[1].getC + 0x10) == 0) | size;
}

Assistant:

static int dynamicPutbuf(struct gdIOCtx *ctx, const void *buf, int size)
{
	dpIOCtx *dctx;
	dctx = (dpIOCtx *)ctx;

	appendDynamic(dctx->dp, buf, size);

	if(dctx->dp->dataGood) {
		return size;
	} else {
		return -1;
	};
}